

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O3

Vec_Ptr_t * Bac_NtkTransformToPtrBoxes(Bac_Ntk_t *p)

{
  byte bVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  
  iVar2 = (p->vType).nSize;
  uVar9 = (ulong)iVar2;
  if ((long)uVar9 < 1) {
    iVar11 = 0;
  }
  else {
    uVar6 = 0;
    iVar11 = 0;
    do {
      bVar1 = (p->vType).pArray[uVar6];
      if ((char)bVar1 < '\0') {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      iVar11 = iVar11 + (uint)(bVar1 < 10);
      uVar6 = uVar6 + 1;
    } while (uVar9 != uVar6);
  }
  uVar8 = iVar2 - iVar11;
  uVar6 = (ulong)uVar8;
  if ((int)uVar8 < 0) {
    __assert_fail("nCap >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                  ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
  }
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = uVar8;
  uVar10 = 0;
  if (iVar2 == iVar11) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((ulong)uVar8 << 3);
  }
  pVVar3->pArray = ppvVar5;
  if (0 < iVar2) {
    uVar10 = 0;
    lVar12 = 0;
    do {
      if (0xffffffbb < ((byte)(p->vType).pArray[lVar12] >> 1) - 0x49) {
        pVVar4 = Bac_NtkTransformToPtrBox(p,(int)lVar12);
        uVar8 = (uint)uVar6;
        if (uVar10 == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar3->pArray,0x80);
            }
            pVVar3->pArray = ppvVar5;
            pVVar3->nCap = 0x10;
            uVar6 = 0x10;
          }
          else {
            uVar6 = (ulong)(uVar8 * 2);
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(uVar6 * 8);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar3->pArray,uVar6 * 8);
            }
            pVVar3->pArray = ppvVar5;
            pVVar3->nCap = uVar8 * 2;
          }
        }
        else {
          ppvVar5 = pVVar3->pArray;
        }
        lVar7 = (long)(int)uVar10;
        uVar10 = uVar10 + 1;
        pVVar3->nSize = uVar10;
        ppvVar5[lVar7] = pVVar4;
        uVar9 = (ulong)(uint)(p->vType).nSize;
      }
      uVar8 = (uint)uVar6;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (int)uVar9);
  }
  if (uVar10 != uVar8) {
    __assert_fail("Vec_PtrSize(vArray) == Vec_PtrCap(vArray)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x6b,"int Ptr_CheckArray(Vec_Ptr_t *)");
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Bac_NtkTransformToPtrBoxes( Bac_Ntk_t * p )
{
    int iBox;
    Vec_Ptr_t * vBoxes = Vec_PtrAllocExact( Bac_NtkBoxNum(p) );
    Bac_NtkForEachBox( p, iBox )
        Vec_PtrPush( vBoxes, Bac_NtkTransformToPtrBox(p, iBox) );
    assert( Ptr_CheckArray(vBoxes) );
    return vBoxes;
}